

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O3

void __thiscall cppjieba::HMMModel::~HMMModel(HMMModel *this)

{
  pointer ppuVar1;
  
  ppuVar1 = (this->emitProbVec).
            super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppuVar1 != (pointer)0x0) {
    operator_delete(ppuVar1,(long)(this->emitProbVec).
                                  super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppuVar1
                   );
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->emitProbS)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->emitProbM)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->emitProbE)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->emitProbB)._M_h);
  return;
}

Assistant:

~HMMModel() {
  }